

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::BasicWriter<char>::write_decimal<int>(BasicWriter<char> *this,int value)

{
  bool bVar1;
  char *pcVar2;
  undefined8 in_RDI;
  BasicWriter<char> *unaff_retaddr;
  MainType abs_value;
  uint value_00;
  
  bVar1 = internal::is_negative<int>(0);
  value_00 = (uint)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    pcVar2 = write_unsigned_decimal<unsigned_int>(unaff_retaddr,value_00,(uint)in_RDI);
    *pcVar2 = '-';
  }
  else {
    write_unsigned_decimal<unsigned_int>(unaff_retaddr,value_00,(uint)in_RDI);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::IntTraits<Int>::MainType MainType;
    MainType abs_value = static_cast<MainType>(value);
    if (internal::is_negative(value)) {
      abs_value = 0 - abs_value;
      *write_unsigned_decimal(abs_value, 1) = '-';
    } else {
      write_unsigned_decimal(abs_value, 0);
    }
  }